

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBoxShape.cpp
# Opt level: O0

void __thiscall btBoxShape::btBoxShape(btBoxShape *this,btVector3 *boxHalfExtents)

{
  long *in_RDI;
  btVector3 bVar1;
  btVector3 margin;
  undefined1 in_stack_ffffffffffffff48 [16];
  undefined1 in_stack_ffffffffffffff58 [16];
  btScalar local_38;
  btScalar local_34;
  btScalar local_30;
  btVector3 local_2c [2];
  
  btPolyhedralConvexShape::btPolyhedralConvexShape(in_stack_ffffffffffffff48._8_8_);
  *in_RDI = (long)&PTR__btBoxShape_002e3ae8;
  *(undefined4 *)(in_RDI + 1) = 0;
  btConvexInternalShape::setSafeMargin
            (in_stack_ffffffffffffff58._8_8_,in_stack_ffffffffffffff58._0_8_,
             in_stack_ffffffffffffff48._12_4_);
  local_30 = (btScalar)(**(code **)(*in_RDI + 0x60))();
  local_34 = (btScalar)(**(code **)(*in_RDI + 0x60))();
  local_38 = (btScalar)(**(code **)(*in_RDI + 0x60))();
  btVector3::btVector3(local_2c,&local_30,&local_34,&local_38);
  ::operator*(in_stack_ffffffffffffff58._8_8_,in_stack_ffffffffffffff58._0_8_);
  bVar1 = operator-(in_stack_ffffffffffffff58._8_8_,in_stack_ffffffffffffff58._0_8_);
  *(long *)((long)in_RDI + 0x2c) = bVar1.m_floats._0_8_;
  *(long *)((long)in_RDI + 0x34) = bVar1.m_floats._8_8_;
  return;
}

Assistant:

btBoxShape::btBoxShape( const btVector3& boxHalfExtents) 
: btPolyhedralConvexShape()
{
	m_shapeType = BOX_SHAPE_PROXYTYPE;

	setSafeMargin(boxHalfExtents);

	btVector3 margin(getMargin(),getMargin(),getMargin());
	m_implicitShapeDimensions = (boxHalfExtents * m_localScaling) - margin;
}